

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.h
# Opt level: O0

void __thiscall
Js::JavascriptLibrary::JavascriptLibrary
          (JavascriptLibrary *this,GlobalObject *globalObject,Recycler *recycler)

{
  Type *local_138;
  Type *local_120;
  Type *local_108;
  WriteBarrierPtr<Js::JavascriptFunction> *local_e8;
  nullptr_t local_e0 [3];
  nullptr_t local_c8;
  nullptr_t local_c0;
  nullptr_t local_b8;
  nullptr_t local_b0;
  nullptr_t local_a8;
  nullptr_t local_a0;
  nullptr_t local_98;
  nullptr_t local_90;
  nullptr_t local_88;
  nullptr_t local_80;
  nullptr_t local_78;
  nullptr_t local_70;
  nullptr_t local_68;
  nullptr_t local_60;
  nullptr_t local_58;
  nullptr_t local_50;
  nullptr_t local_48;
  nullptr_t local_40;
  nullptr_t local_38;
  nullptr_t local_30;
  nullptr_t local_28;
  Recycler *local_20;
  Recycler *recycler_local;
  GlobalObject *globalObject_local;
  JavascriptLibrary *this_local;
  
  local_20 = recycler;
  recycler_local = (Recycler *)globalObject;
  globalObject_local = (GlobalObject *)this;
  JavascriptLibraryBase::JavascriptLibraryBase(&this->super_JavascriptLibraryBase,globalObject);
  (this->super_JavascriptLibraryBase).super_FinalizableObject.super_IRecyclerVisitedObject.
  _vptr_IRecyclerVisitedObject = (_func_int **)&PTR_Finalize_01e06f38;
  local_28 = (nullptr_t)0x0;
  Memory::WriteBarrierPtr<Js::CacheForCopyOnAccessArraySegments>::WriteBarrierPtr
            (&this->cacheForCopyOnAccessArraySegments,&local_28);
  local_30 = (nullptr_t)0x0;
  Memory::WriteBarrierPtr<Js::ExternalLibraryBase>::WriteBarrierPtr
            (&this->externalLibraryList,&local_30);
  Memory::WriteBarrierPtr<Js::UndeclaredBlockVariable>::WriteBarrierPtr
            (&this->undeclBlockVarSentinel);
  Memory::WriteBarrierPtr<Js::DynamicType>::WriteBarrierPtr
            (&this->generatorConstructorPrototypeObjectType);
  Memory::WriteBarrierPtr<Js::DynamicType>::WriteBarrierPtr
            (&this->asyncGeneratorConstructorPrototypeObjectType);
  Memory::WriteBarrierPtr<Js::DynamicType>::WriteBarrierPtr(&this->constructorPrototypeObjectType);
  Memory::WriteBarrierPtr<Js::DynamicType>::WriteBarrierPtr(&this->heapArgumentsType);
  Memory::WriteBarrierPtr<Js::DynamicType>::WriteBarrierPtr(&this->strictHeapArgumentsType);
  Memory::WriteBarrierPtr<Js::DynamicType>::WriteBarrierPtr(&this->activationObjectType);
  Memory::WriteBarrierPtr<Js::DynamicType>::WriteBarrierPtr(&this->arrayType);
  Memory::WriteBarrierPtr<Js::DynamicType>::WriteBarrierPtr(&this->nativeIntArrayType);
  Memory::WriteBarrierPtr<Js::DynamicType>::WriteBarrierPtr(&this->copyOnAccessNativeIntArrayType);
  Memory::WriteBarrierPtr<Js::DynamicType>::WriteBarrierPtr(&this->nativeFloatArrayType);
  Memory::WriteBarrierPtr<Js::DynamicType>::WriteBarrierPtr(&this->arrayBufferType);
  Memory::WriteBarrierPtr<Js::DynamicType>::WriteBarrierPtr(&this->sharedArrayBufferType);
  Memory::WriteBarrierPtr<Js::DynamicType>::WriteBarrierPtr(&this->dataViewType);
  Memory::WriteBarrierPtr<Js::DynamicType>::WriteBarrierPtr(&this->int8ArrayType);
  Memory::WriteBarrierPtr<Js::DynamicType>::WriteBarrierPtr(&this->uint8ArrayType);
  Memory::WriteBarrierPtr<Js::DynamicType>::WriteBarrierPtr(&this->uint8ClampedArrayType);
  Memory::WriteBarrierPtr<Js::DynamicType>::WriteBarrierPtr(&this->int16ArrayType);
  Memory::WriteBarrierPtr<Js::DynamicType>::WriteBarrierPtr(&this->uint16ArrayType);
  Memory::WriteBarrierPtr<Js::DynamicType>::WriteBarrierPtr(&this->int32ArrayType);
  Memory::WriteBarrierPtr<Js::DynamicType>::WriteBarrierPtr(&this->uint32ArrayType);
  Memory::WriteBarrierPtr<Js::DynamicType>::WriteBarrierPtr(&this->float32ArrayType);
  Memory::WriteBarrierPtr<Js::DynamicType>::WriteBarrierPtr(&this->float64ArrayType);
  Memory::WriteBarrierPtr<Js::DynamicType>::WriteBarrierPtr(&this->int64ArrayType);
  Memory::WriteBarrierPtr<Js::DynamicType>::WriteBarrierPtr(&this->uint64ArrayType);
  Memory::WriteBarrierPtr<Js::DynamicType>::WriteBarrierPtr(&this->boolArrayType);
  Memory::WriteBarrierPtr<Js::DynamicType>::WriteBarrierPtr(&this->charArrayType);
  Memory::WriteBarrierPtr<Js::StaticType>::WriteBarrierPtr(&this->booleanTypeStatic);
  Memory::WriteBarrierPtr<Js::DynamicType>::WriteBarrierPtr(&this->booleanTypeDynamic);
  Memory::WriteBarrierPtr<Js::DynamicType>::WriteBarrierPtr(&this->bigintTypeDynamic);
  Memory::WriteBarrierPtr<Js::StaticType>::WriteBarrierPtr(&this->bigintTypeStatic);
  Memory::WriteBarrierPtr<Js::DynamicType>::WriteBarrierPtr(&this->dateType);
  Memory::WriteBarrierPtr<Js::DynamicType>::WriteBarrierPtr(&this->symbolTypeDynamic);
  Memory::WriteBarrierPtr<Js::StaticType>::WriteBarrierPtr(&this->symbolTypeStatic);
  Memory::WriteBarrierPtr<Js::DynamicType>::WriteBarrierPtr(&this->iteratorResultType);
  Memory::WriteBarrierPtr<Js::DynamicType>::WriteBarrierPtr(&this->awaitObjectType);
  Memory::WriteBarrierPtr<Js::DynamicType>::WriteBarrierPtr(&this->resumeYieldObjectType);
  Memory::WriteBarrierPtr<Js::DynamicType>::WriteBarrierPtr(&this->arrayIteratorType);
  Memory::WriteBarrierPtr<Js::DynamicType>::WriteBarrierPtr(&this->mapIteratorType);
  Memory::WriteBarrierPtr<Js::DynamicType>::WriteBarrierPtr(&this->setIteratorType);
  Memory::WriteBarrierPtr<Js::DynamicType>::WriteBarrierPtr(&this->stringIteratorType);
  Memory::WriteBarrierPtr<Js::DynamicType>::WriteBarrierPtr(&this->promiseType);
  Memory::WriteBarrierPtr<Js::DynamicType>::WriteBarrierPtr(&this->listIteratorType);
  local_e8 = (WriteBarrierPtr<Js::JavascriptFunction> *)&this->field_0x650;
  do {
    Memory::WriteBarrierPtr<Js::JavascriptFunction>::WriteBarrierPtr(local_e8);
    local_e8 = local_e8 + 1;
  } while (local_e8 != (WriteBarrierPtr<Js::JavascriptFunction> *)this->vtableAddresses);
  local_108 = this->typeDisplayStrings;
  do {
    Memory::WriteBarrierPtr<Js::JavascriptString>::WriteBarrierPtr(local_108);
    local_108 = local_108 + 1;
  } while ((Type *)local_108 != &this->constructorCacheDefaultInstance);
  Memory::WriteBarrierPtr<Js::ConstructorCache>::WriteBarrierPtr
            (&this->constructorCacheDefaultInstance);
  Memory::WriteBarrierPtr<const_unsigned_char>::WriteBarrierPtr(&this->absDoubleCst);
  Memory::WriteBarrierPtr<const_double>::WriteBarrierPtr(&this->uintConvertConst);
  Memory::WriteBarrierPtr<Js::DynamicTypeHandler>::WriteBarrierPtr
            (&this->anonymousFunctionTypeHandler);
  Memory::WriteBarrierPtr<Js::DynamicTypeHandler>::WriteBarrierPtr
            (&this->anonymousFunctionWithPrototypeTypeHandler);
  Memory::WriteBarrierPtr<Js::DynamicTypeHandler>::WriteBarrierPtr(&this->functionTypeHandler);
  Memory::WriteBarrierPtr<Js::DynamicTypeHandler>::WriteBarrierPtr
            (&this->functionTypeHandlerWithLength);
  Memory::WriteBarrierPtr<Js::DynamicTypeHandler>::WriteBarrierPtr
            (&this->functionWithPrototypeAndLengthTypeHandler);
  Memory::WriteBarrierPtr<Js::DynamicTypeHandler>::WriteBarrierPtr
            (&this->functionWithPrototypeTypeHandler);
  Memory::WriteBarrierPtr<Js::DynamicTypeHandler>::WriteBarrierPtr(&this->classPrototypeTypeHandler)
  ;
  Memory::WriteBarrierPtr<Js::DynamicType>::WriteBarrierPtr
            (&this->externalFunctionWithDeferredPrototypeType);
  Memory::WriteBarrierPtr<Js::DynamicType>::WriteBarrierPtr
            (&this->externalFunctionWithLengthAndDeferredPrototypeType);
  Memory::WriteBarrierPtr<Js::DynamicType>::WriteBarrierPtr
            (&this->wrappedFunctionWithDeferredPrototypeType);
  Memory::WriteBarrierPtr<Js::DynamicType>::WriteBarrierPtr
            (&this->stdCallFunctionWithDeferredPrototypeType);
  Memory::WriteBarrierPtr<Js::DynamicType>::WriteBarrierPtr
            (&this->idMappedFunctionWithPrototypeType);
  Memory::WriteBarrierPtr<Js::DynamicType>::WriteBarrierPtr
            (&this->externalConstructorFunctionWithDeferredPrototypeType);
  Memory::WriteBarrierPtr<Js::DynamicType>::WriteBarrierPtr
            (&this->defaultExternalConstructorFunctionWithDeferredPrototypeType);
  Memory::WriteBarrierPtr<Js::DynamicType>::WriteBarrierPtr(&this->boundFunctionType);
  Memory::WriteBarrierPtr<Js::DynamicType>::WriteBarrierPtr(&this->regexConstructorType);
  Memory::WriteBarrierPtr<Js::DynamicType>::WriteBarrierPtr(&this->crossSiteDeferredFunctionType);
  Memory::WriteBarrierPtr<Js::DynamicType>::WriteBarrierPtr
            (&this->crossSiteDeferredPrototypeFunctionType);
  Memory::WriteBarrierPtr<Js::DynamicType>::WriteBarrierPtr
            (&this->crossSiteIdMappedFunctionWithPrototypeType);
  Memory::WriteBarrierPtr<Js::DynamicType>::WriteBarrierPtr
            (&this->crossSiteExternalConstructFunctionWithPrototypeType);
  Memory::WriteBarrierPtr<Js::StaticType>::WriteBarrierPtr(&this->enumeratorType);
  Memory::WriteBarrierPtr<Js::DynamicType>::WriteBarrierPtr(&this->errorType);
  Memory::WriteBarrierPtr<Js::DynamicType>::WriteBarrierPtr(&this->evalErrorType);
  Memory::WriteBarrierPtr<Js::DynamicType>::WriteBarrierPtr(&this->rangeErrorType);
  Memory::WriteBarrierPtr<Js::DynamicType>::WriteBarrierPtr(&this->referenceErrorType);
  Memory::WriteBarrierPtr<Js::DynamicType>::WriteBarrierPtr(&this->syntaxErrorType);
  Memory::WriteBarrierPtr<Js::DynamicType>::WriteBarrierPtr(&this->typeErrorType);
  Memory::WriteBarrierPtr<Js::DynamicType>::WriteBarrierPtr(&this->uriErrorType);
  Memory::WriteBarrierPtr<Js::DynamicType>::WriteBarrierPtr(&this->aggregateErrorType);
  Memory::WriteBarrierPtr<Js::DynamicType>::WriteBarrierPtr(&this->webAssemblyCompileErrorType);
  Memory::WriteBarrierPtr<Js::DynamicType>::WriteBarrierPtr(&this->webAssemblyRuntimeErrorType);
  Memory::WriteBarrierPtr<Js::DynamicType>::WriteBarrierPtr(&this->webAssemblyLinkErrorType);
  Memory::WriteBarrierPtr<Js::StaticType>::WriteBarrierPtr(&this->numberTypeStatic);
  Memory::WriteBarrierPtr<Js::StaticType>::WriteBarrierPtr(&this->int64NumberTypeStatic);
  Memory::WriteBarrierPtr<Js::StaticType>::WriteBarrierPtr(&this->uint64NumberTypeStatic);
  Memory::WriteBarrierPtr<Js::DynamicType>::WriteBarrierPtr(&this->webAssemblyModuleType);
  Memory::WriteBarrierPtr<Js::DynamicType>::WriteBarrierPtr(&this->webAssemblyInstanceType);
  Memory::WriteBarrierPtr<Js::DynamicType>::WriteBarrierPtr(&this->webAssemblyMemoryType);
  Memory::WriteBarrierPtr<Js::DynamicType>::WriteBarrierPtr(&this->webAssemblyTableType);
  Memory::WriteBarrierPtr<Js::DynamicType>::WriteBarrierPtr(&this->numberTypeDynamic);
  local_120 = this->objectTypes;
  do {
    Memory::WriteBarrierPtr<Js::DynamicType>::WriteBarrierPtr(local_120);
    local_120 = local_120 + 1;
  } while (local_120 != this->objectHeaderInlinedTypes);
  local_138 = this->objectHeaderInlinedTypes;
  do {
    Memory::WriteBarrierPtr<Js::DynamicType>::WriteBarrierPtr(local_138);
    local_138 = local_138 + 1;
  } while (local_138 != &this->nullPrototypeObjectType);
  Memory::WriteBarrierPtr<Js::DynamicType>::WriteBarrierPtr(&this->nullPrototypeObjectType);
  Memory::WriteBarrierPtr<Js::DynamicType>::WriteBarrierPtr(&this->regexPrototypeType);
  Memory::WriteBarrierPtr<Js::DynamicType>::WriteBarrierPtr(&this->regexType);
  Memory::WriteBarrierPtr<Js::DynamicType>::WriteBarrierPtr(&this->regexResultType);
  Memory::WriteBarrierPtr<Js::DynamicType>::WriteBarrierPtr(&this->stringTypeDynamic);
  Memory::WriteBarrierPtr<Js::DynamicType>::WriteBarrierPtr(&this->mapType);
  Memory::WriteBarrierPtr<Js::DynamicType>::WriteBarrierPtr(&this->setType);
  Memory::WriteBarrierPtr<Js::DynamicType>::WriteBarrierPtr(&this->weakMapType);
  Memory::WriteBarrierPtr<Js::DynamicType>::WriteBarrierPtr(&this->weakSetType);
  Memory::WriteBarrierPtr<Js::DynamicType>::WriteBarrierPtr(&this->proxyType);
  Memory::WriteBarrierPtr<Js::StaticType>::WriteBarrierPtr(&this->withType);
  Memory::WriteBarrierPtr<Js::DynamicType>::WriteBarrierPtr(&this->SpreadArgumentType);
  Memory::WriteBarrierPtr<Js::DynamicType>::WriteBarrierPtr(&this->moduleNamespaceType);
  PropertyDescriptor::PropertyDescriptor(&this->defaultPropertyDescriptor);
  StringCache::StringCache(&this->stringCache);
  Memory::WriteBarrierPtr<Js::JavascriptString>::WriteBarrierPtr(&this->nullString);
  Memory::WriteBarrierPtr<Js::JavascriptString>::WriteBarrierPtr(&this->emptyString);
  Memory::WriteBarrierPtr<Js::JavascriptString>::WriteBarrierPtr(&this->symbolTypeDisplayString);
  Memory::WriteBarrierPtr<Js::JavascriptString>::WriteBarrierPtr
            (&this->debuggerDeadZoneBlockVariableString);
  Memory::WriteBarrierPtr<Js::DynamicObject>::WriteBarrierPtr(&this->missingPropertyHolder);
  Memory::WriteBarrierPtr<Js::StaticType>::WriteBarrierPtr(&this->throwErrorObjectType);
  local_38 = (nullptr_t)0x0;
  Memory::
  WriteBarrierPtr<JsUtil::WeakReferenceRegionDictionary<int,_Js::PropertyString_*,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::NoResizeLock>_>
  ::WriteBarrierPtr(&this->propertyStringMap,&local_38);
  local_40 = (nullptr_t)0x0;
  Memory::
  WriteBarrierPtr<JsUtil::WeakReferenceRegionDictionary<int,_Js::JavascriptSymbol_*,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::NoResizeLock>_>
  ::WriteBarrierPtr(&this->symbolMap,&local_40);
  Memory::WriteBarrierPtr<Js::ConstructorCache>::WriteBarrierPtr(&this->builtInConstructorCache);
  Memory::WriteBarrierPtr<Js::DynamicObject>::WriteBarrierPtr(&this->chakraLibraryObject);
  Memory::WriteBarrierPtr<Js::JavascriptFunction>::WriteBarrierPtr
            (&this->debugObjectFaultInjectionCookieGetterFunction);
  Memory::WriteBarrierPtr<Js::JavascriptFunction>::WriteBarrierPtr
            (&this->debugObjectFaultInjectionCookieSetterFunction);
  local_48 = (nullptr_t)0x0;
  Memory::WriteBarrierPtr<Js::JavascriptFunction>::WriteBarrierPtr
            (&this->evalFunctionObject,&local_48);
  Memory::WriteBarrierPtr<Js::JavascriptFunction>::WriteBarrierPtr
            (&this->arrayPrototypeValuesFunction);
  local_50 = (nullptr_t)0x0;
  Memory::WriteBarrierPtr<Js::JavascriptFunction>::WriteBarrierPtr
            (&this->parseIntFunctionObject,&local_50);
  local_58 = (nullptr_t)0x0;
  Memory::WriteBarrierPtr<Js::JavascriptFunction>::WriteBarrierPtr
            (&this->parseFloatFunctionObject,&local_58);
  local_60 = (nullptr_t)0x0;
  Memory::WriteBarrierPtr<Js::JavascriptFunction>::WriteBarrierPtr
            (&this->arrayPrototypeToStringFunction,&local_60);
  local_68 = (nullptr_t)0x0;
  Memory::WriteBarrierPtr<Js::JavascriptFunction>::WriteBarrierPtr
            (&this->arrayPrototypeToLocaleStringFunction,&local_68);
  local_70 = (nullptr_t)0x0;
  Memory::WriteBarrierPtr<Js::JavascriptFunction>::WriteBarrierPtr
            (&this->identityFunction,&local_70);
  local_78 = (nullptr_t)0x0;
  Memory::WriteBarrierPtr<Js::JavascriptFunction>::WriteBarrierPtr(&this->throwerFunction,&local_78)
  ;
  Memory::WriteBarrierPtr<Js::JavascriptFunction>::WriteBarrierPtr(&this->generatorReturnFunction);
  Memory::WriteBarrierPtr<Js::JavascriptFunction>::WriteBarrierPtr(&this->generatorNextFunction);
  Memory::WriteBarrierPtr<Js::JavascriptFunction>::WriteBarrierPtr(&this->generatorThrowFunction);
  Memory::WriteBarrierPtr<Js::JavascriptFunction>::WriteBarrierPtr
            (&this->asyncGeneratorNextFunction);
  Memory::WriteBarrierPtr<Js::JavascriptFunction>::WriteBarrierPtr
            (&this->asyncGeneratorReturnFunction);
  Memory::WriteBarrierPtr<Js::JavascriptFunction>::WriteBarrierPtr
            (&this->asyncGeneratorThrowFunction);
  Memory::WriteBarrierPtr<Js::JavascriptFunction>::WriteBarrierPtr
            (&this->asyncFromSyncIteratorNextFunction);
  Memory::WriteBarrierPtr<Js::JavascriptFunction>::WriteBarrierPtr
            (&this->asyncFromSyncIteratorReturnFunction);
  Memory::WriteBarrierPtr<Js::JavascriptFunction>::WriteBarrierPtr
            (&this->asyncFromSyncIteratorThrowFunction);
  Memory::WriteBarrierPtr<Js::RuntimeFunction>::WriteBarrierPtr
            (&this->asyncFromSyncIteratorValueUnwrapFalseFunction);
  Memory::WriteBarrierPtr<Js::RuntimeFunction>::WriteBarrierPtr
            (&this->asyncFromSyncIteratorValueUnwrapTrueFunction);
  Memory::WriteBarrierPtr<Js::JavascriptFunction>::WriteBarrierPtr(&this->objectValueOfFunction);
  Memory::WriteBarrierPtr<Js::JavascriptFunction>::WriteBarrierPtr(&this->objectToStringFunction);
  Memory::WriteBarrierPtr<Js::JavascriptFunction>::WriteBarrierPtr(&this->isArrayFunction);
  Memory::WriteBarrierPtr<Js::DynamicObject>::WriteBarrierPtr(&this->webAssemblyObject);
  Memory::WriteBarrierPtr<Js::JavascriptFunction>::WriteBarrierPtr
            (&this->webAssemblyQueryResponseFunction);
  Memory::WriteBarrierPtr<Js::JavascriptFunction>::WriteBarrierPtr
            (&this->webAssemblyCompileFunction);
  Memory::WriteBarrierPtr<Js::JavascriptFunction>::WriteBarrierPtr
            (&this->webAssemblyInstantiateBoundFunction);
  Memory::WriteBarrierPtr<Js::JavascriptSymbol>::WriteBarrierPtr(&this->symbolMatch);
  Memory::WriteBarrierPtr<Js::JavascriptSymbol>::WriteBarrierPtr(&this->symbolReplace);
  Memory::WriteBarrierPtr<Js::JavascriptSymbol>::WriteBarrierPtr(&this->symbolSearch);
  Memory::WriteBarrierPtr<Js::JavascriptSymbol>::WriteBarrierPtr(&this->symbolSplit);
  Memory::WriteBarrierPtr<UnifiedRegex::RegexPattern>::WriteBarrierPtr(&this->emptyRegexPattern);
  Memory::WriteBarrierPtr<Js::JavascriptFunction>::WriteBarrierPtr(&this->regexExecFunction);
  Memory::WriteBarrierPtr<Js::JavascriptFunction>::WriteBarrierPtr(&this->regexFlagsGetterFunction);
  Memory::WriteBarrierPtr<Js::JavascriptFunction>::WriteBarrierPtr(&this->regexGlobalGetterFunction)
  ;
  Memory::WriteBarrierPtr<Js::JavascriptFunction>::WriteBarrierPtr(&this->regexStickyGetterFunction)
  ;
  Memory::WriteBarrierPtr<Js::JavascriptFunction>::WriteBarrierPtr(&this->regexDotAllGetterFunction)
  ;
  Memory::WriteBarrierPtr<Js::JavascriptFunction>::WriteBarrierPtr
            (&this->regexUnicodeGetterFunction);
  Memory::WriteBarrierPtr<Js::RuntimeFunction>::WriteBarrierPtr(&this->sharedArrayBufferConstructor)
  ;
  Memory::WriteBarrierPtr<Js::DynamicObject>::WriteBarrierPtr(&this->sharedArrayBufferPrototype);
  Memory::WriteBarrierPtr<Js::DynamicObject>::WriteBarrierPtr(&this->atomicsObject);
  Memory::WriteBarrierPtr<Js::DynamicObject>::WriteBarrierPtr
            (&this->webAssemblyCompileErrorPrototype);
  Memory::WriteBarrierPtr<Js::RuntimeFunction>::WriteBarrierPtr
            (&this->webAssemblyCompileErrorConstructor);
  Memory::WriteBarrierPtr<Js::DynamicObject>::WriteBarrierPtr
            (&this->webAssemblyRuntimeErrorPrototype);
  Memory::WriteBarrierPtr<Js::RuntimeFunction>::WriteBarrierPtr
            (&this->webAssemblyRuntimeErrorConstructor);
  Memory::WriteBarrierPtr<Js::DynamicObject>::WriteBarrierPtr(&this->webAssemblyLinkErrorPrototype);
  Memory::WriteBarrierPtr<Js::RuntimeFunction>::WriteBarrierPtr
            (&this->webAssemblyLinkErrorConstructor);
  Memory::WriteBarrierPtr<Js::DynamicObject>::WriteBarrierPtr(&this->webAssemblyMemoryPrototype);
  Memory::WriteBarrierPtr<Js::RuntimeFunction>::WriteBarrierPtr(&this->webAssemblyMemoryConstructor)
  ;
  Memory::WriteBarrierPtr<Js::DynamicObject>::WriteBarrierPtr(&this->webAssemblyModulePrototype);
  Memory::WriteBarrierPtr<Js::RuntimeFunction>::WriteBarrierPtr(&this->webAssemblyModuleConstructor)
  ;
  Memory::WriteBarrierPtr<Js::DynamicObject>::WriteBarrierPtr(&this->webAssemblyInstancePrototype);
  Memory::WriteBarrierPtr<Js::RuntimeFunction>::WriteBarrierPtr
            (&this->webAssemblyInstanceConstructor);
  Memory::WriteBarrierPtr<Js::DynamicObject>::WriteBarrierPtr(&this->webAssemblyTablePrototype);
  Memory::WriteBarrierPtr<Js::RuntimeFunction>::WriteBarrierPtr(&this->webAssemblyTableConstructor);
  CharStringCache::CharStringCache(&this->charStringCache);
  Memory::WriteBarrierPtr<void>::WriteBarrierPtr(&this->nativeHostPromiseContinuationFunctionState);
  local_80 = (nullptr_t)0x0;
  Memory::WriteBarrierPtr<void>::WriteBarrierPtr(&this->bindRefChunkBegin,&local_80);
  local_88 = (nullptr_t)0x0;
  Memory::WriteBarrierPtr<Memory::WriteBarrierPtr<void>_>::WriteBarrierPtr
            (&this->bindRefChunkCurrent,&local_88);
  local_90 = (nullptr_t)0x0;
  Memory::WriteBarrierPtr<Memory::WriteBarrierPtr<void>_>::WriteBarrierPtr
            (&this->bindRefChunkEnd,&local_90);
  local_98 = (nullptr_t)0x0;
  Memory::WriteBarrierPtr<Js::TypePath>::WriteBarrierPtr(&this->rootPath,&local_98);
  Cache::Cache(&this->cache);
  local_a0 = (nullptr_t)0x0;
  Memory::WriteBarrierPtr<SList<Js::FunctionProxy_*,_Memory::Recycler,_RealCount>_>::WriteBarrierPtr
            (&this->dynamicFunctionReference,&local_a0);
  local_a8 = (nullptr_t)0x0;
  Memory::WriteBarrierPtr<FinalizableObject>::WriteBarrierPtr(&this->jsrtContextObject,&local_a8);
  local_b0 = (nullptr_t)0x0;
  Memory::
  WriteBarrierPtr<JsUtil::WeakReferenceDictionary<Js::JavascriptLibrary::JsrtExternalCallbacks,_Js::DynamicType,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_DefaultComparer>_>
  ::WriteBarrierPtr(&this->jsrtExternalTypesCache,&local_b0);
  local_b8 = (nullptr_t)0x0;
  Memory::WriteBarrierPtr<Js::FunctionBody>::WriteBarrierPtr
            (&this->fakeGlobalFuncForUndefer,&local_b8);
  local_c0 = (nullptr_t)0x0;
  Memory::
  WriteBarrierPtr<JsUtil::WeakReferenceDictionary<Js::JavascriptLibrary::CustomExternalWrapperCallbacks,_Js::DynamicType,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_DefaultComparer>_>
  ::WriteBarrierPtr(&this->customExternalWrapperTypesCache,&local_c0);
  local_c8 = (nullptr_t)0x0;
  Memory::
  WriteBarrierPtr<JsUtil::List<Js::SourceTextModuleRecord_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>_>
  ::WriteBarrierPtr(&this->moduleRecordList,&local_c8);
  PrototypeChainCache<Js::OnlyWritablePropertyCache>::PrototypeChainCache
            (&this->typesWithOnlyWritablePropertyProtoChain,local_20);
  PrototypeChainCache<Js::NoSpecialPropertyCache>::PrototypeChainCache
            (&this->typesWithNoSpecialPropertyProtoChain,local_20);
  this->inProfileMode = false;
  this->inDispatchProfileMode = false;
  Memory::WriteBarrierPtr<Js::DynamicType>::WriteBarrierPtr(&this->debugDisposableObjectType);
  Memory::WriteBarrierPtr<Js::DynamicType>::WriteBarrierPtr
            (&this->debugFuncExecutorInDisposeObjectType);
  local_e0[0] = (nullptr_t)0x0;
  Memory::
  WriteBarrierPtr<JsUtil::BaseHashSet<const_Js::PropertyRecord_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_const_Js::PropertyRecord_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
  ::WriteBarrierPtr(&this->referencedPropertyRecords,local_e0);
  Memory::WriteBarrierPtr<Js::GlobalObject>::operator=
            (&(this->super_JavascriptLibraryBase).globalObject,(GlobalObject *)recycler_local);
  return;
}

Assistant:

JavascriptLibrary(GlobalObject* globalObject, Recycler * recycler) :
            JavascriptLibraryBase(globalObject),
            inProfileMode(false),
            inDispatchProfileMode(false),
            propertyStringMap(nullptr),
            symbolMap(nullptr),
            parseIntFunctionObject(nullptr),
            evalFunctionObject(nullptr),
            parseFloatFunctionObject(nullptr),
            arrayPrototypeToLocaleStringFunction(nullptr),
            arrayPrototypeToStringFunction(nullptr),
            identityFunction(nullptr),
            throwerFunction(nullptr),
            jsrtContextObject(nullptr),
            jsrtExternalTypesCache(nullptr),
            customExternalWrapperTypesCache(nullptr),
            fakeGlobalFuncForUndefer(nullptr),
            externalLibraryList(nullptr),
#if ENABLE_COPYONACCESS_ARRAY
            cacheForCopyOnAccessArraySegments(nullptr),
#endif
            referencedPropertyRecords(nullptr),
            moduleRecordList(nullptr),
            rootPath(nullptr),
            bindRefChunkBegin(nullptr),
            bindRefChunkCurrent(nullptr),
            bindRefChunkEnd(nullptr),
            dynamicFunctionReference(nullptr),
            typesWithOnlyWritablePropertyProtoChain(recycler),
            typesWithNoSpecialPropertyProtoChain(recycler)
        {
            this->globalObject = globalObject;
        }